

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst
          (MoveRegToMemByRegPlusConst *this,CTemp *target,int constant,CTemp *source)

{
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_0017cf98;
  std::__cxx11::string::string((string *)&this->target,(string *)target);
  this->constant = constant;
  std::__cxx11::string::string((string *)&this->source,(string *)source);
  return;
}

Assistant:

AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst( const IRT::CTemp &target, int constant,
                                                                      const IRT::CTemp &source ) : target( target ),
                                                                                                   constant( constant ),
                                                                                                   source( source ) { }